

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void computeFloor(DateTime *p)

{
  DateTime *p_local;
  
  if (p->D < 0x1d) {
    p->nFloor = '\0';
  }
  else if ((1 << ((byte)p->M & 0x1f) & 0x15aaU) == 0) {
    if (p->M == 2) {
      if ((p->Y % 4 == 0) && ((p->Y % 100 != 0 || (p->Y % 400 == 0)))) {
        p->nFloor = (char)p->D + -0x1d;
      }
      else {
        p->nFloor = (char)p->D + -0x1c;
      }
    }
    else {
      p->nFloor = p->D == 0x1f;
    }
  }
  else {
    p->nFloor = '\0';
  }
  return;
}

Assistant:

static void computeFloor(DateTime *p){
  assert( p->validYMD || p->isError );
  assert( p->D>=0 && p->D<=31 );
  assert( p->M>=0 && p->M<=12 );
  if( p->D<=28 ){
    p->nFloor = 0;
  }else if( (1<<p->M) & 0x15aa ){
    p->nFloor = 0;
  }else if( p->M!=2 ){
    p->nFloor = (p->D==31);
  }else if( p->Y%4!=0 || (p->Y%100==0 && p->Y%400!=0) ){
    p->nFloor = p->D - 28;
  }else{
    p->nFloor = p->D - 29;
  }
}